

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_cry_BigNum.cpp
# Opt level: O0

bool __thiscall axl::cry::BigNum::getDecString(BigNum *this,String *string)

{
  StringBase<char,_axl::sl::StringDetailsBase<char>_> *this_00;
  undefined8 *in_RDI;
  char *p;
  C *in_stack_ffffffffffffffd8;
  undefined1 local_1;
  
  this_00 = (StringBase<char,_axl::sl::StringDetailsBase<char>_> *)BN_bn2dec((BIGNUM *)*in_RDI);
  if (this_00 == (StringBase<char,_axl::sl::StringDetailsBase<char>_> *)0x0) {
    local_1 = failWithLastCryptoError();
  }
  else {
    sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::operator=
              (this_00,in_stack_ffffffffffffffd8);
    CRYPTO_free(this_00);
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool
BigNum::getDecString(sl::String* string) {
	char* p = BN_bn2dec(m_h);
	if (!p)
		return failWithLastCryptoError();

	*string = p;
	OPENSSL_free(p);
	return true;
}